

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

string * __thiscall
(anonymous_namespace)::gtest_AllECCurveTest_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestParamInfo<int> *info)

{
  bool bVar1;
  TestParamInfo<int> *extraout_RDX;
  TestParamInfo<int> *extraout_RDX_00;
  TestParamInfo<int> *params;
  vector<int,_std::allocator<int>_> local_58;
  ParamGenerator<int> local_40;
  undefined1 local_30 [8];
  tuple<testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
  t;
  TestParamInfo<int> *info_local;
  
  t.
  super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
  .super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  bVar1 = testing::internal::AlwaysFalse();
  params = extraout_RDX;
  if (bVar1) {
    testing::internal::TestNotEmpty<std::__cxx11::string(testing::TestParamInfo<int>const&)>
              (CurveToString_abi_cxx11_);
    anon_unknown.dwarf_263068::AllCurves();
    testing::ValuesIn<std::vector<int,std::allocator<int>>>((testing *)&local_40,&local_58);
    std::
    make_tuple<testing::internal::ParamGenerator<int>,std::__cxx11::string(&)(testing::TestParamInfo<int>const&)>
              ((tuple<testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
                *)local_30,&local_40,CurveToString_abi_cxx11_);
    testing::internal::ParamGenerator<int>::~ParamGenerator(&local_40);
    std::vector<int,_std::allocator<int>_>::~vector(&local_58);
    std::
    tuple<testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
    ::~tuple((tuple<testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
              *)local_30);
    params = extraout_RDX_00;
  }
  CurveToString_abi_cxx11_
            (__return_storage_ptr__,
             (_anonymous_namespace_ *)
             t.
             super__Tuple_impl<0UL,_testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
             .super__Head_base<0UL,_testing::internal::ParamGenerator<int>,_false>._M_head_impl.
             impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi,params);
  return __return_storage_ptr__;
}

Assistant:

static const EC_GROUP *GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return EC_group_p224();
  }
  if (curve_name == "P-256") {
    return EC_group_p256();
  }
  if (curve_name == "P-384") {
    return EC_group_p384();
  }
  if (curve_name == "P-521") {
    return EC_group_p521();
  }

  t->PrintLine("Unknown curve '%s'", curve_name.c_str());
  return nullptr;
}